

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp.c
# Opt level: O1

int strcmp(char *__s1,char *__s2)

{
  byte bVar1;
  byte *pbVar2;
  
  bVar1 = *__s1;
  if (bVar1 != 0) {
    pbVar2 = (byte *)(__s1 + 1);
    do {
      if (bVar1 != *__s2) break;
      __s2 = (char *)((byte *)__s2 + 1);
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  return (uint)bVar1 - (uint)(byte)*__s2;
}

Assistant:

int strcmp( const char * s1, const char * s2 )
{
    while ( ( *s1 ) && ( *s1 == *s2 ) )
    {
        ++s1;
        ++s2;
    }

    return ( *( unsigned char * )s1 - * ( unsigned char * )s2 );
}